

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.h
# Opt level: O0

node<adj_ribs_in_data> *
search_prefix<adj_ribs_in_data>
          (node<adj_ribs_in_data> *root,uint32_t address,uint8_t max_prefix_len,
          bool is_prefix_strict)

{
  bool bVar1;
  node<adj_ribs_in_data> *local_48;
  byte local_39;
  node<adj_ribs_in_data> *pnStack_38;
  uint8_t i;
  node<adj_ribs_in_data> *match_node;
  node<adj_ribs_in_data> *next;
  node<adj_ribs_in_data> *current;
  bool is_prefix_strict_local;
  uint8_t max_prefix_len_local;
  uint32_t address_local;
  node<adj_ribs_in_data> *root_local;
  
  local_39 = 0;
  pnStack_38 = root;
  next = root;
  while( true ) {
    if (max_prefix_len <= local_39) {
      if (((is_prefix_strict) && (max_prefix_len != '\0')) && (pnStack_38->prefix_len == '\0')) {
        root_local = (node<adj_ribs_in_data> *)0x0;
      }
      else {
        root_local = pnStack_38;
      }
      return root_local;
    }
    bVar1 = check_bit(address,local_39);
    if (bVar1) {
      local_48 = next->node_1;
    }
    else {
      local_48 = next->node_0;
    }
    if (local_48 == (node<adj_ribs_in_data> *)0x0) break;
    if ((local_48->is_prefix & 1U) != 0) {
      pnStack_38 = local_48;
    }
    next = local_48;
    local_39 = local_39 + 1;
  }
  if (is_prefix_strict) {
    return (node<adj_ribs_in_data> *)0x0;
  }
  return pnStack_38;
}

Assistant:

node<DATA_TYPE>* search_prefix(node<DATA_TYPE>* root, uint32_t address, uint8_t max_prefix_len = 32, bool is_prefix_strict = false){
    node<DATA_TYPE>* current = root;
    node<DATA_TYPE>* next = nullptr;
    node<DATA_TYPE>* match_node = root;
    uint8_t i = 0;
    while(i < max_prefix_len){
        next = (check_bit(address, i) ? current->node_1 : current->node_0);
        if(next == nullptr){
            if(is_prefix_strict){
                return nullptr;
            }
            return match_node;
        }
        if(next->is_prefix){
            match_node = next;
        }
        current = next;
        i++;
    }
    if(is_prefix_strict and max_prefix_len != 0 and match_node->prefix_len == 0){
        return nullptr;
    }
    return match_node;
}